

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<SparsityPrinter>>
::
ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<SparsityPrinter>>::AlgebraicConHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<SparsityPrinter>>
           *this)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  BinaryReader<mp::internal::EndiannessConverter> *this_00;
  ArgList local_58;
  ulong local_48 [3];
  
  iVar2 = *(int *)(*(long *)(this + 8) + 4);
  if (0 < iVar2) {
    do {
      this_00 = *(BinaryReader<mp::internal::EndiannessConverter> **)this;
      pcVar3 = (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (this_00->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
      (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
      switch(*pcVar3) {
      case '0':
        BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
        this_00 = *(BinaryReader<mp::internal::EndiannessConverter> **)this;
      case '1':
      case '2':
      case '4':
        BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
        break;
      case '3':
        break;
      case '5':
        BinaryReader<mp::internal::EndiannessConverter>::ReadInt<int>(this_00);
        uVar1 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
                          (*(BinaryReader<mp::internal::EndiannessConverter> **)this);
        if ((uVar1 == 0) || (**(int **)(this + 8) < (int)uVar1)) {
          this_00 = *(BinaryReader<mp::internal::EndiannessConverter> **)this;
          local_48[0] = (ulong)uVar1;
          local_58.types_ = 2;
          pcVar3 = "integer {} out of bounds";
          goto LAB_00119905;
        }
        break;
      default:
        local_48[0] = 0;
        local_48[1] = 0;
        local_58.types_ = 0;
        pcVar3 = "expected bound";
LAB_00119905:
        local_58.field_1.values_ = (Value *)local_48;
        BinaryReaderBase::ReportError(&this_00->super_BinaryReaderBase,(CStringRef)pcVar3,&local_58)
        ;
      }
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

int num_items() const { return this->reader_.header_.num_algebraic_cons; }